

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expFuncRound(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
            vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  pointer pEVar1;
  anon_union_8_2_b358304e_for_ExpressionValue_1 aVar2;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  pEVar1 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar1->type == Float) {
    aVar2.intValue = llround((pEVar1->field_1).floatValue);
  }
  else {
    if (pEVar1->type != Integer) {
      return __return_storage_ptr__;
    }
    aVar2 = pEVar1->field_1;
  }
  __return_storage_ptr__->field_1 = aVar2;
  __return_storage_ptr__->type = Integer;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncRound(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;

	switch (parameters[0].type)
	{
	case ExpressionValueType::Integer:
		result.intValue = parameters[0].intValue;
		break;
	case ExpressionValueType::Float:
		result.intValue = llround(parameters[0].floatValue);
		break;
	default:
		return result;
	}

	result.type = ExpressionValueType::Integer;
	return result;
}